

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

void nk_draw_symbol(nk_command_buffer *out,nk_symbol_type type,nk_rect content,nk_color background,
                   nk_color foreground,float border_width,nk_user_font *font)

{
  nk_heading direction;
  char *string;
  float fVar1;
  float fVar2;
  nk_rect rect;
  nk_rect r;
  nk_vec2 points [3];
  float local_68;
  float fStack_64;
  float local_58;
  float fStack_54;
  nk_text local_38;
  float local_28;
  float local_24;
  
  switch(type) {
  case NK_SYMBOL_X:
    string = "x";
    break;
  case NK_SYMBOL_UNDERSCORE:
    string = "_";
    break;
  case NK_SYMBOL_CIRCLE_SOLID:
  case NK_SYMBOL_CIRCLE_OUTLINE:
  case NK_SYMBOL_RECT_SOLID:
  case NK_SYMBOL_RECT_OUTLINE:
    local_68 = content.w;
    fStack_64 = content.h;
    local_58 = content.x;
    fStack_54 = content.y;
    if (1 < type - NK_SYMBOL_RECT_SOLID) {
      nk_fill_circle(out,content,foreground);
      if (type != NK_SYMBOL_CIRCLE_OUTLINE) {
        return;
      }
      fVar1 = 2.0;
      if (2.0 <= local_68) {
        fVar1 = local_68;
      }
      fVar2 = 2.0;
      if (2.0 <= fStack_64) {
        fVar2 = fStack_64;
      }
      r.x = local_58 + 1.0;
      r.w = fVar1 + -2.0;
      r.y = fStack_54 + 1.0;
      r.h = fVar2 + -2.0;
      nk_fill_circle(out,r,background);
      return;
    }
    nk_fill_rect(out,content,0.0,foreground);
    if (type != NK_SYMBOL_RECT_OUTLINE) {
      return;
    }
    fVar2 = border_width + border_width;
    fVar1 = fVar2;
    if (fVar2 <= local_68) {
      fVar1 = local_68;
    }
    if (fVar2 <= fStack_64) {
      fVar2 = fStack_64;
    }
    rect.x = local_58 + border_width;
    rect.w = fVar1 + border_width * -2.0;
    rect.y = fStack_54 + border_width;
    rect.h = border_width * -2.0 + fVar2;
    nk_fill_rect(out,rect,0.0,background);
    return;
  case NK_SYMBOL_TRIANGLE_UP:
  case NK_SYMBOL_TRIANGLE_DOWN:
  case NK_SYMBOL_TRIANGLE_LEFT:
  case NK_SYMBOL_TRIANGLE_RIGHT:
    if (type == NK_SYMBOL_TRIANGLE_LEFT) {
      direction = NK_LEFT;
    }
    else {
      direction = NK_RIGHT;
      if (type != NK_SYMBOL_TRIANGLE_RIGHT) {
        direction = (uint)(type != NK_SYMBOL_TRIANGLE_UP) * 2;
      }
    }
    nk_triangle_from_direction(&local_38.padding,content,0.0,0.0,direction);
    nk_fill_triangle(out,local_38.padding.x,local_38.padding.y,(float)local_38.background,
                     (float)local_38.text,local_28,local_24,foreground);
    return;
  case NK_SYMBOL_PLUS:
  case NK_SYMBOL_MINUS:
    string = "-";
    if (type == NK_SYMBOL_PLUS) {
      string = "+";
    }
    break;
  default:
    goto switchD_00132175_default;
  }
  local_38.padding.x = 0.0;
  local_38.padding.y = 0.0;
  local_38.background = background;
  local_38.text = foreground;
  nk_widget_text(out,content,string,1,&local_38,0x12,font);
switchD_00132175_default:
  return;
}

Assistant:

NK_LIB void
nk_draw_symbol(struct nk_command_buffer *out, enum nk_symbol_type type,
    struct nk_rect content, struct nk_color background, struct nk_color foreground,
    float border_width, const struct nk_user_font *font)
{
    switch (type) {
    case NK_SYMBOL_X:
    case NK_SYMBOL_UNDERSCORE:
    case NK_SYMBOL_PLUS:
    case NK_SYMBOL_MINUS: {
        /* single character text symbol */
        const char *X = (type == NK_SYMBOL_X) ? "x":
            (type == NK_SYMBOL_UNDERSCORE) ? "_":
            (type == NK_SYMBOL_PLUS) ? "+": "-";
        struct nk_text text;
        text.padding = nk_vec2(0,0);
        text.background = background;
        text.text = foreground;
        nk_widget_text(out, content, X, 1, &text, NK_TEXT_CENTERED, font);
    } break;
    case NK_SYMBOL_CIRCLE_SOLID:
    case NK_SYMBOL_CIRCLE_OUTLINE:
    case NK_SYMBOL_RECT_SOLID:
    case NK_SYMBOL_RECT_OUTLINE: {
        /* simple empty/filled shapes */
        if (type == NK_SYMBOL_RECT_SOLID || type == NK_SYMBOL_RECT_OUTLINE) {
            nk_fill_rect(out, content,  0, foreground);
            if (type == NK_SYMBOL_RECT_OUTLINE)
                nk_fill_rect(out, nk_shrink_rect(content, border_width), 0, background);
        } else {
            nk_fill_circle(out, content, foreground);
            if (type == NK_SYMBOL_CIRCLE_OUTLINE)
                nk_fill_circle(out, nk_shrink_rect(content, 1), background);
        }
    } break;
    case NK_SYMBOL_TRIANGLE_UP:
    case NK_SYMBOL_TRIANGLE_DOWN:
    case NK_SYMBOL_TRIANGLE_LEFT:
    case NK_SYMBOL_TRIANGLE_RIGHT: {
        enum nk_heading heading;
        struct nk_vec2 points[3];
        heading = (type == NK_SYMBOL_TRIANGLE_RIGHT) ? NK_RIGHT :
            (type == NK_SYMBOL_TRIANGLE_LEFT) ? NK_LEFT:
            (type == NK_SYMBOL_TRIANGLE_UP) ? NK_UP: NK_DOWN;
        nk_triangle_from_direction(points, content, 0, 0, heading);
        nk_fill_triangle(out, points[0].x, points[0].y, points[1].x, points[1].y,
            points[2].x, points[2].y, foreground);
    } break;
    default:
    case NK_SYMBOL_NONE:
    case NK_SYMBOL_MAX: break;
    }
}